

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_time.cpp
# Opt level: O3

Am_Wrapper * __thiscall Am_Time_Data::Make_Unique(Am_Time_Data *this)

{
  uint uVar1;
  __suseconds_t _Var2;
  Am_Time_Data *pAVar3;
  
  uVar1 = (this->super_Am_Wrapper).refs;
  pAVar3 = this;
  if (uVar1 != 1) {
    (this->super_Am_Wrapper).refs = uVar1 - 1;
    pAVar3 = (Am_Time_Data *)operator_new(0x20);
    (pAVar3->super_Am_Wrapper).refs = 1;
    (pAVar3->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type =
         (_func_int **)&PTR_ID_002e37a0;
    _Var2 = (this->time).tv_usec;
    (pAVar3->time).tv_sec = (this->time).tv_sec;
    (pAVar3->time).tv_usec = _Var2;
  }
  return &pAVar3->super_Am_Wrapper;
}

Assistant:

void
Am_Time_Data::Print(std::ostream &os) const
{
  //  os << time.tv_sec <<"s:"<< time.tv_usec << "us";
  os << time.tv_sec * 1000 + time.tv_usec / 1000 << " milliseconds";
}